

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_invalid_key_exception.cpp
# Opt level: O0

void __thiscall
argo::json_invalid_key_exception::json_invalid_key_exception
          (json_invalid_key_exception *this,exception_type et,string *key)

{
  char *__src;
  string *key_local;
  exception_type et_local;
  json_invalid_key_exception *this_local;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__json_invalid_key_exception_00132aa0;
  if (et == invalid_key_e) {
    strncpy((this->super_json_exception).m_message,"invalid object key: ",200);
    __src = (char *)std::__cxx11::string::c_str();
    strncpy((this->super_json_exception).m_message,__src,200);
  }
  else {
    strncpy((this->super_json_exception).m_message,"generic",200);
  }
  return;
}

Assistant:

json_invalid_key_exception::json_invalid_key_exception(exception_type et, const string &key) noexcept : json_exception(et)
{
    if (et == invalid_key_e)
    {
        strncpy(m_message, "invalid object key: ", max_message_length);
        strncpy(m_message, key.c_str(), max_message_length);
    }
    else
    {
        strncpy(m_message, "generic", max_message_length);
    }
}